

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_writer.cc
# Opt level: O2

void __thiscall
tcmalloc::anon_unknown_0::ChunkedStorageWriter::~ChunkedStorageWriter(ChunkedStorageWriter *this)

{
  (this->super_GenericWriter)._vptr_GenericWriter =
       (_func_int **)&PTR__ChunkedStorageWriter_00141fa0;
  GenericWriter::FinalRecycle(&this->super_GenericWriter);
  (this->super_GenericWriter)._vptr_GenericWriter = (_func_int **)&PTR__GenericWriter_00141f28;
  return;
}

Assistant:

~ChunkedStorageWriter() override {
    FinalRecycle();
  }